

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O0

void __thiscall PressDelayHandler::pressed(PressDelayHandler *this,QEvent *e,int delay)

{
  long lVar1;
  bool bVar2;
  MouseButton MVar3;
  undefined4 uVar4;
  QWidget *p;
  QMouseEvent *pQVar5;
  QPointF *in_RSI;
  Duration in_RDI;
  long in_FS_OFFSET;
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *in_stack_ffffffffffffff60;
  QPoint *in_stack_ffffffffffffff98;
  QEvent *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::operator!
                    ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)
                     (in_RDI.__r + 0x18));
  if (bVar2) {
    p = (QWidget *)(in_RDI.__r + 0x18);
    copyMouseEvent(local_40);
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::reset
              (in_stack_ffffffffffffff60,(QMouseEvent *)in_RDI.__r);
    pQVar5 = (QMouseEvent *)(in_RDI.__r + 0x10);
    ms<(char)49>();
    std::chrono::operator*((int *)p,(duration<long,_std::ratio<1L,_1000L>_> *)0xa7f19c);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)pQVar5,
               (duration<long,_std::ratio<1L,_1000L>_> *)p);
    QBasicTimer::start((QBasicTimer *)p,in_RDI,(QObject *)0xa7f1d0);
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::operator->
              ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)
               (in_RDI.__r + 0x18));
    QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa7f1e6);
    QPointF::toPoint(in_RSI);
    QApplication::widgetAt(in_stack_ffffffffffffff98);
    QPointer<QWidget>::operator=((QPointer<QWidget> *)pQVar5,p);
    pQVar5 = QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::operator->
                       ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)
                        (in_RDI.__r + 0x18));
    MVar3 = QSinglePointEvent::button((QSinglePointEvent *)pQVar5);
    *(MouseButton *)(in_RDI.__r + 0x24) = MVar3;
    QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::operator->
              ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)
               (in_RDI.__r + 0x18));
    uVar4 = QMouseEvent::source();
    *(undefined4 *)(in_RDI.__r + 0x38) = uVar4;
  }
  (**(code **)((long)in_RSI->xp + 0x10))(in_RSI,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pressed(QEvent *e, int delay)
    {
        if (!pressDelayEvent) {
            pressDelayEvent.reset(copyMouseEvent(e));
            using namespace std::chrono_literals;
            pressDelayTimer.start(delay * 1ms, this);
            mouseTarget = QApplication::widgetAt(pressDelayEvent->globalPosition().toPoint());
            mouseButton = pressDelayEvent->button();
            mouseEventSource = pressDelayEvent->source();
            qFGDebug("QFG: consuming/delaying mouse press");
        } else {
            qFGDebug("QFG: NOT consuming/delaying mouse press");
        }
        e->setAccepted(true);
    }